

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O2

mcu8str * mctools_get_current_working_dir(void)

{
  char *pcVar1;
  int *piVar2;
  mcu8str *in_RDI;
  char *__buf;
  size_t __size;
  char buf [4096];
  char local_1018 [4096];
  
  __buf = local_1018;
  in_RDI->owns_memory = 0;
  in_RDI->c_str = local_1018;
  local_1018[0] = '\0';
  in_RDI->size = 0;
  in_RDI->buflen = 0x1000;
  __size = 0x1000;
  while( true ) {
    pcVar1 = getcwd(__buf,__size);
    if (pcVar1 != (char *)0x0) {
      mcu8str_update_size(in_RDI);
      mcu8str_ensure_dynamic_buffer(in_RDI);
      mctools_pathseps_platform(in_RDI);
      return in_RDI;
    }
    piVar2 = __errno_location();
    if ((1999999 < (uint)__size) || (*piVar2 != 0x22)) break;
    if (in_RDI->size != 0) {
      *__buf = '\0';
      in_RDI->size = 0;
    }
    mcu8str_reserve(in_RDI,(ulong)((uint)__size * 2 - 2));
    __buf = in_RDI->c_str;
    __size = (size_t)in_RDI->buflen;
  }
  mcu8str_dealloc(in_RDI);
  mctools_impl_error("Failed to get current working directory");
}

Assistant:

mcu8str mctools_get_current_working_dir(void)
  {
#ifdef MC_IS_WINDOWS
    mcwinstr wpath = mc_winstr_create( 4096 );
    DWORD nsize = GetCurrentDirectoryW((DWORD)wpath.buflen, wpath.c_str);
    if ( (mcu8str_size_t)(nsize + 1) > wpath.buflen ) {
      //Use larger buffer and try again:
      mc_winstr_dealloc( &wpath );
      wpath = mc_winstr_create( nsize );
      nsize = GetCurrentDirectoryW((DWORD)wpath.buflen,wpath.c_str);
    }
    if ( nsize == 0 || (mcu8str_size_t )( nsize + 1 ) > wpath.buflen ) {
      mc_winstr_dealloc( &wpath );
      mctools_impl_error("Failed to get current working directory");
      //return mcu8str_create_empty();
    }
    wpath.c_str[nsize] = 0;
    wpath.size = nsize;
    mcwinstr woutput = mc_impl_expand_wpath_to_longpathname( &wpath );
    mc_winstr_dealloc( &wpath );
    mcu8str res = mc_winstr_to_u8str( &woutput );
    mc_winstr_dealloc( &woutput );
    mctools_pathseps_platform( &res );
    return res;
#else
    char buf[4096];//almost always enough in first go
    mcu8str res = mcu8str_create_from_staticbuffer( buf, sizeof(buf) );
    while ( 1 ) {
      if ( getcwd( res.c_str, res.buflen ) ) {
        mcu8str_update_size( &res );
        mcu8str_ensure_dynamic_buffer(&res);//don't return local static buffer
        mctools_pathseps_platform( &res );
        return res;
      }
      if ( errno == ERANGE && res.buflen < 2000000 ) {
        //Try again with larger buffer:
        mcu8str_clear( &res );
        mcu8str_reserve( &res, (res.buflen-1) * 2 );
      } else {
        mcu8str_dealloc( &res );
        mctools_impl_error("Failed to get current working directory");
        //return mcu8str_create_empty();
      }
    }
#endif
  }